

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTiming.c
# Opt level: O2

void Aig_ManUpdateLevel(Aig_Man_t *p,Aig_Obj_t *pObjNew)

{
  int iVar1;
  uint Level;
  uint uVar2;
  uint uVar3;
  int Level_00;
  Vec_Vec_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj_00;
  int i;
  
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                  ,199,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
  }
  if ((*(uint *)&pObjNew->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pObjNew)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                  ,200,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
  }
  if (p->vLevels == (Vec_Vec_t *)0x0) {
    iVar1 = Aig_ManLevels(p);
    pVVar4 = Vec_VecAlloc(iVar1 + 8);
    p->vLevels = pVVar4;
  }
  Level = Aig_ObjLevel(pObjNew);
  uVar2 = Aig_ObjLevelNew(pObjNew);
  if (Level != uVar2) {
    Vec_VecClear(p->vLevels);
    Vec_VecPush(p->vLevels,Level,pObjNew);
    pObjNew->field_0x18 = pObjNew->field_0x18 | 0x10;
    iVar1 = -1;
    for (; pVVar4 = p->vLevels, (int)Level < pVVar4->nSize; Level = Level + 1) {
      for (i = 0; pVVar5 = Vec_VecEntry(pVVar4,Level), i < pVVar5->nSize; i = i + 1) {
        pVVar5 = Vec_VecEntry(p->vLevels,Level);
        pObj = (Aig_Obj_t *)Vec_PtrEntry(pVVar5,i);
        pObj->field_0x18 = pObj->field_0x18 & 0xef;
        uVar2 = Aig_ObjLevel(pObj);
        if (uVar2 != Level) {
          __assert_fail("Aig_ObjLevel(pTemp) == Lev",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                        ,0xda,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
        }
        uVar2 = Aig_ObjLevelNew(pObj);
        *(ulong *)&pObj->field_0x18 =
             *(ulong *)&pObj->field_0x18 & 0xff000000ffffffff | (ulong)(uVar2 & 0xffffff) << 0x20;
        uVar2 = Aig_ObjLevel(pObj);
        if (uVar2 != Level) {
          if (p->pFanData == (int *)0x0) {
            __assert_fail("p->pFanData",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                          ,0xe0,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
          }
          for (uVar2 = 0; uVar2 < *(uint *)&pObj->field_0x18 >> 6; uVar2 = uVar2 + 1) {
            if (uVar2 == 0) {
              iVar1 = Aig_ObjFanout0Int(p,pObj->Id);
            }
            else {
              iVar1 = Aig_ObjFanoutNext(p,iVar1);
            }
            pObj_00 = Aig_ManObj(p,iVar1 >> 1);
            if (((*(ulong *)&pObj_00->field_0x18 & 0x10) == 0) &&
               (((uint)*(ulong *)&pObj_00->field_0x18 & 7) - 5 < 2)) {
              uVar3 = Aig_ObjLevel(pObj_00);
              if (uVar3 < Level) {
                __assert_fail("Aig_ObjLevel(pFanout) >= Lev",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigTiming.c"
                              ,0xe4,"void Aig_ManUpdateLevel(Aig_Man_t *, Aig_Obj_t *)");
              }
              pVVar4 = p->vLevels;
              Level_00 = Aig_ObjLevel(pObj_00);
              Vec_VecPush(pVVar4,Level_00,pObj_00);
              pObj_00->field_0x18 = pObj_00->field_0x18 | 0x10;
            }
          }
        }
        pVVar4 = p->vLevels;
      }
    }
  }
  return;
}

Assistant:

void Aig_ManUpdateLevel( Aig_Man_t * p, Aig_Obj_t * pObjNew )
{
    Aig_Obj_t * pFanout, * pTemp;
    int iFanout = -1, LevelOld, Lev, k, m;
    assert( p->pFanData != NULL );
    assert( Aig_ObjIsNode(pObjNew) );
    // allocate level if needed
    if ( p->vLevels == NULL )
        p->vLevels = Vec_VecAlloc( Aig_ManLevels(p) + 8 );
    // check if level has changed
    LevelOld = Aig_ObjLevel(pObjNew);
    if ( LevelOld == Aig_ObjLevelNew(pObjNew) )
        return;
    // start the data structure for level update
    // we cannot fail to visit a node when using this structure because the 
    // nodes are stored by their _old_ levels, which are assumed to be correct
    Vec_VecClear( p->vLevels );
    Vec_VecPush( p->vLevels, LevelOld, pObjNew );
    pObjNew->fMarkA = 1;
    // recursively update level
    Vec_VecForEachEntryStart( Aig_Obj_t *, p->vLevels, pTemp, Lev, k, LevelOld )
    {
        pTemp->fMarkA = 0;
        assert( Aig_ObjLevel(pTemp) == Lev );
        pTemp->Level = Aig_ObjLevelNew(pTemp);
        // if the level did not change, no need to check the fanout levels
        if ( Aig_ObjLevel(pTemp) == Lev )
            continue;
        // schedule fanout for level update
        Aig_ObjForEachFanout( p, pTemp, pFanout, iFanout, m )
        {
            if ( Aig_ObjIsNode(pFanout) && !pFanout->fMarkA )
            {
                assert( Aig_ObjLevel(pFanout) >= Lev );
                Vec_VecPush( p->vLevels, Aig_ObjLevel(pFanout), pFanout );
                pFanout->fMarkA = 1;
            }
        }
    }
}